

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralAction::~IfcStructuralAction(IfcStructuralAction *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject = 0x842750;
  *(undefined8 *)&this->field_0x178 = 0x842840;
  *(undefined8 *)&(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.field_0x88 =
       0x842778;
  (this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8427a0;
  *(undefined8 *)&(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.field_0xd0 =
       0x8427c8;
  *(undefined8 *)&(this->super_IfcStructuralActivity).super_IfcProduct.field_0x100 = 0x8427f0;
  *(undefined8 *)&(this->super_IfcStructuralActivity).field_0x138 = 0x842818;
  puVar1 = *(undefined1 **)&(this->super_IfcStructuralActivity).field_0x148;
  if (puVar1 != &this->field_0x158) {
    operator_delete(puVar1,*(long *)&this->field_0x158 + 1);
  }
  IfcStructuralActivity::~IfcStructuralActivity
            (&this->super_IfcStructuralActivity,&PTR_construction_vtable_24__00842858);
  operator_delete(this,400);
  return;
}

Assistant:

IfcStructuralAction() : Object("IfcStructuralAction") {}